

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program_options.cpp
# Opt level: O2

void __thiscall
Potassco::ProgramOptions::OptionGroup::format
          (OptionGroup *this,OptionOutput *out,size_t maxW,DescriptionLevel dl)

{
  pointer pIVar1;
  pointer pIVar2;
  
  pIVar1 = (this->options_).
           super__Vector_base<Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>,_std::allocator<Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pIVar2 = (this->options_).
                super__Vector_base<Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>,_std::allocator<Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pIVar2 != pIVar1; pIVar2 = pIVar2 + 1) {
    if ((int)(uint)(pIVar2->ptr_->value_->flags_ >> 5) <= (int)dl) {
      (*out->_vptr_OptionOutput[4])(out,pIVar2->ptr_,maxW);
    }
  }
  return;
}

Assistant:

void OptionGroup::format(OptionOutput& out, size_t maxW, DescriptionLevel dl) const {
	for (option_iterator it = options_.begin(), end = options_.end(); it != end; ++it) {
		if ((*it)->descLevel() <= dl) {
			out.printOption(**it, maxW);
		}
	}
}